

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O0

void __thiscall Movegen::encode_capture_promotions(Movegen *this,U64 *b,int *dir)

{
  int iVar1;
  Movetype local_48;
  U8 local_42;
  U8 local_41;
  Movetype local_40;
  U8 local_3a;
  U8 local_39;
  Movetype local_38;
  U8 local_32;
  U8 local_31;
  Movetype local_30;
  U8 local_2a;
  U8 local_29;
  int local_28;
  int local_24;
  Square f;
  Square to;
  int *dir_local;
  U64 *b_local;
  Movegen *this_local;
  
  _f = dir;
  dir_local = (int *)b;
  b_local = (U64 *)this;
  while (*(long *)dir_local != 0) {
    local_24 = bits::pop_lsb((U64 *)dir_local);
    local_28 = local_24 + *_f;
    iVar1 = this->last;
    this->last = iVar1 + 1;
    local_29 = (U8)local_28;
    local_2a = (U8)local_24;
    local_30 = capture_promotion_q;
    Move::set(this->list + iVar1,&local_29,&local_2a,&local_30);
    iVar1 = this->last;
    this->last = iVar1 + 1;
    local_31 = (U8)local_28;
    local_32 = (U8)local_24;
    local_38 = capture_promotion_r;
    Move::set(this->list + iVar1,&local_31,&local_32,&local_38);
    iVar1 = this->last;
    this->last = iVar1 + 1;
    local_39 = (U8)local_28;
    local_3a = (U8)local_24;
    local_40 = capture_promotion_b;
    Move::set(this->list + iVar1,&local_39,&local_3a,&local_40);
    iVar1 = this->last;
    this->last = iVar1 + 1;
    local_41 = (U8)local_28;
    local_42 = (U8)local_24;
    local_48 = capture_promotion_n;
    Move::set(this->list + iVar1,&local_41,&local_42,&local_48);
  }
  return;
}

Assistant:

inline void Movegen::encode_capture_promotions(U64& b, const int& dir) {
	while (b) {
		Square to = Square(bits::pop_lsb(b));
		Square f = Square(to + dir);
		list[last++].set(f, to, capture_promotion_q);
		list[last++].set(f, to, capture_promotion_r);
		list[last++].set(f, to, capture_promotion_b);
		list[last++].set(f, to, capture_promotion_n);
	}
}